

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

void replay_read_commandlist(void)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char *token;
  char decbuf [256];
  int local_c;
  int i;
  
  pcVar2 = next_log_token();
  lVar3 = strtol(pcVar2,(char **)0x0,0x10);
  cmdcount = (int)lVar3;
  if (cmdcount == 0) {
    parse_error("expected number of commands");
  }
  cmdcount = cmdcount + 1;
  commands = (char **)malloc((long)cmdcount << 3);
  *commands = (char *)0x0;
  local_c = 1;
  while( true ) {
    if (cmdcount <= local_c) {
      return;
    }
    pcVar2 = next_log_token();
    iVar1 = base64_strlen(pcVar2);
    if (0x200 < iVar1) break;
    base64_decode(pcVar2,(char *)&token);
    pcVar2 = strdup((char *)&token);
    commands[local_c] = pcVar2;
    local_c = local_c + 1;
  }
  parse_error("Encoded command name is too long for the decode buffer");
}

Assistant:

static void replay_read_commandlist(void)
{
    int i;
    char decbuf[BUFSZ], *token;
    
    cmdcount = strtol(next_log_token(), NULL, 16);
    if (!cmdcount)
	parse_error("expected number of commands");
    cmdcount++; /* the NULL command is not in the list */
    commands = malloc(cmdcount * sizeof(char*));
    commands[0] = NULL;
    
    for (i = 1; i < cmdcount; i++) {
	token = next_log_token();
	if (base64_strlen(token) > ENCBUFSZ)
	    parse_error("Encoded command name is too long for the decode buffer");
	base64_decode(token, decbuf);
	commands[i] = strdup(decbuf);
    }
}